

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O0

uint32_t __thiscall draco::RAnsSymbolDecoder<14>::DecodeSymbol(RAnsSymbolDecoder<14> *this)

{
  uint32_t uVar1;
  RAnsDecoder<20> *in_stack_00000020;
  
  uVar1 = RAnsDecoder<20>::rans_read(in_stack_00000020);
  return uVar1;
}

Assistant:

uint32_t DecodeSymbol() { return ans_.rans_read(); }